

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall FIX::HttpServer::onConfigure(HttpServer *this,SessionSettings *s)

{
  int iVar1;
  Dictionary *this_00;
  allocator<char> local_39;
  string local_38;
  SessionSettings *local_18;
  SessionSettings *s_local;
  HttpServer *this_local;
  
  local_18 = s;
  s_local = (SessionSettings *)this;
  this_00 = SessionSettings::get(s);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"HttpAcceptPort",&local_39)
  ;
  iVar1 = Dictionary::getInt(this_00,&local_38);
  this->m_port = iVar1;
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void HttpServer::onConfigure( const SessionSettings& s )
EXCEPT ( ConfigError )
{
  m_port = s.get().getInt( HTTP_ACCEPT_PORT );
}